

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MS3DLoader.cpp
# Opt level: O1

void __thiscall
Assimp::MS3DImporter::CollectChildJoints
          (MS3DImporter *this,
          vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
          *joints,vector<bool,_std::allocator<bool>_> *hadit,aiNode *nd,aiMatrix4x4 *absTrafo)

{
  ulong *puVar1;
  _Bit_type *p_Var2;
  aiMesh *paVar3;
  aiBone *paVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  int iVar21;
  aiNode **ppaVar22;
  aiNode *this_00;
  size_t sVar23;
  aiScene *paVar24;
  aiMatrix4x4t<float> *paVar25;
  ulong uVar26;
  char *pcVar27;
  pointer __s;
  vector<bool,_std::allocator<bool>_> *pvVar28;
  ulong uVar29;
  vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_> *pvVar30
  ;
  uint uVar31;
  pointer pTVar32;
  ulong uVar33;
  aiNode *paVar34;
  long lVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  uint extraout_XMM0_Db;
  uint extraout_XMM0_Dc;
  uint extraout_XMM0_Dd;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  aiMatrix4x4 abs;
  undefined1 local_198 [20];
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  ulong local_148;
  MS3DImporter *local_140;
  float local_134;
  float local_130;
  float local_12c;
  float local_128;
  uint uStack_124;
  uint uStack_120;
  uint uStack_11c;
  vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
  *local_110;
  vector<bool,_std::allocator<bool>_> *local_108;
  aiNode *local_100;
  ulong local_f8;
  ulong local_f0;
  float local_e8;
  uint uStack_e4;
  uint uStack_e0;
  uint uStack_dc;
  aiMatrix4x4 *local_d0;
  char *local_c8;
  ulong local_c0;
  ulong local_b8;
  long local_b0;
  float local_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  float local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  float local_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  pointer local_78;
  size_type sStack_70;
  size_type local_68;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  pTVar32 = (joints->
            super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
            )._M_impl.super__Vector_impl_data._M_start;
  lVar35 = (long)(joints->
                 super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar32;
  local_140 = this;
  local_110 = joints;
  local_108 = hadit;
  local_100 = nd;
  local_d0 = absTrafo;
  if (lVar35 == 0) {
    uVar31 = 0;
  }
  else {
    lVar35 = (lVar35 >> 4) * 0x2e8ba2e8ba2e8ba3;
    p_Var2 = (hadit->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p;
    pcVar27 = pTVar32->parentName;
    uVar31 = 0;
    uVar33 = 0;
    do {
      uVar26 = uVar33 + 0x3f;
      if (-1 < (long)uVar33) {
        uVar26 = uVar33;
      }
      if ((p_Var2[((long)uVar26 >> 6) +
                  (ulong)((uVar33 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff]
           >> (uVar33 & 0x3f) & 1) == 0) {
        iVar21 = strcmp(pcVar27,(nd->mName).data);
        uVar31 = uVar31 + (iVar21 == 0);
      }
      uVar33 = uVar33 + 1;
      pcVar27 = pcVar27 + 0xb0;
    } while (lVar35 + (ulong)(lVar35 == 0) != uVar33);
  }
  paVar34 = local_100;
  local_100->mNumChildren = uVar31;
  ppaVar22 = (aiNode **)operator_new__((ulong)uVar31 << 3);
  paVar34->mChildren = ppaVar22;
  pTVar32 = (local_110->
            super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((local_110->
      super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
      )._M_impl.super__Vector_impl_data._M_finish != pTVar32) {
    local_c8 = (paVar34->mName).data;
    local_148 = 0;
    uVar33 = 0x800000000000003f;
    uVar26 = 0;
    local_f8 = 0x800000000000003f;
    pvVar28 = local_108;
    pvVar30 = local_110;
    do {
      uVar29 = uVar26 + 0x3f;
      if (-1 < (long)uVar26) {
        uVar29 = uVar26;
      }
      local_b0 = ((long)uVar29 >> 6) * 8;
      local_b8 = (ulong)((uVar26 & uVar33) < 0x8000000000000001);
      local_c0 = 1L << ((byte)uVar26 & 0x3f);
      local_f0 = uVar26;
      if (((pvVar28->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p
           [((long)uVar29 >> 6) + local_b8 + 0xffffffffffffffff] >> (uVar26 & 0x3f) & 1) == 0) {
        iVar21 = strcmp(pTVar32[uVar26].parentName,local_c8);
        uVar33 = local_f8;
        if (iVar21 == 0) {
          __s = pTVar32 + uVar26;
          this_00 = (aiNode *)operator_new(0x478);
          local_198._0_8_ = local_198 + 0x10;
          if (pTVar32 == (pointer)0x0) {
            pcVar27 = (char *)0x1;
          }
          else {
            sVar23 = strlen(__s->name);
            pcVar27 = __s->name + sVar23;
          }
          std::__cxx11::string::_M_construct<char_const*>((string *)local_198,__s,pcVar27);
          aiNode::aiNode(this_00,(string *)local_198);
          paVar34->mChildren[local_148 & 0xffffffff] = this_00;
          if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
            operator_delete((void *)local_198._0_8_);
          }
          this_00->mParent = paVar34;
          pTVar32 = (pvVar30->
                    super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          fVar40 = pTVar32[uVar26].position.x;
          fVar43 = pTVar32[uVar26].position.y;
          fVar47 = pTVar32[uVar26].position.z;
          fVar37 = pTVar32[uVar26].rotation.x;
          fVar38 = pTVar32[uVar26].rotation.y;
          local_158 = pTVar32[uVar26].rotation.z;
          fVar36 = cosf(fVar37);
          fVar37 = sinf(fVar37);
          local_128 = cosf(fVar38);
          local_e8 = sinf(fVar38);
          uStack_e4 = extraout_XMM0_Db;
          uStack_e0 = extraout_XMM0_Dc;
          uStack_dc = extraout_XMM0_Dd;
          fVar38 = cosf(local_158);
          fVar39 = sinf(local_158);
          fVar52 = local_128 * fVar38;
          fVar51 = local_e8 * fVar38 * fVar37 - fVar36 * fVar39;
          fVar56 = fVar39 * fVar37 + fVar36 * local_e8 * fVar38;
          fVar49 = local_128 * fVar39;
          fVar44 = fVar38 * fVar36 + fVar37 * fVar39 * local_e8;
          fVar55 = fVar39 * local_e8 * fVar36 - fVar37 * fVar38;
          uStack_154 = uStack_e4 ^ 0x80000000;
          uStack_150 = uStack_e0 ^ 0x80000000;
          uStack_14c = uStack_dc ^ 0x80000000;
          fVar37 = fVar37 * local_128;
          fVar36 = fVar36 * local_128;
          fVar48 = fVar49 * 0.0;
          fVar38 = -local_e8 * 0.0;
          fVar41 = fVar40 * 0.0;
          fVar45 = fVar52 + fVar48 + fVar38 + fVar41;
          fVar53 = fVar44 * 0.0;
          fVar39 = fVar37 * 0.0;
          local_128 = fVar51 + fVar53 + fVar39 + fVar41;
          uStack_124 = uStack_e4;
          uStack_120 = uStack_e0;
          uStack_11c = uStack_dc;
          fVar54 = fVar55 * 0.0;
          fVar46 = fVar36 * 0.0;
          fVar41 = fVar56 + fVar54 + fVar46 + fVar41;
          fVar52 = fVar52 * 0.0;
          fVar42 = fVar43 * 0.0;
          fVar50 = fVar49 + fVar52 + fVar38 + fVar42;
          fVar51 = fVar51 * 0.0;
          fVar49 = fVar44 + fVar51 + fVar39 + fVar42;
          fVar56 = fVar56 * 0.0;
          fVar42 = fVar55 + fVar56 + fVar46 + fVar42;
          fVar52 = fVar52 + fVar48;
          fVar51 = fVar51 + fVar53;
          fVar56 = fVar56 + fVar54;
          fVar44 = fVar47 * 0.0;
          fVar48 = (fVar52 - local_e8) + fVar44;
          fVar37 = fVar37 + fVar51 + fVar44;
          fVar44 = fVar36 + fVar56 + fVar44;
          fVar40 = fVar40 + 0.0;
          fVar43 = fVar43 + 0.0;
          fVar47 = fVar47 + 0.0;
          local_158 = fVar38 + fVar52 + 0.0;
          fVar38 = fVar51 + fVar39 + 0.0;
          fVar36 = fVar56 + fVar46 + 0.0;
          (this_00->mTransformation).a1 = fVar45;
          (this_00->mTransformation).a2 = local_128;
          (this_00->mTransformation).a3 = fVar41;
          (this_00->mTransformation).a4 = fVar40;
          (this_00->mTransformation).b1 = fVar50;
          (this_00->mTransformation).b2 = fVar49;
          (this_00->mTransformation).b3 = fVar42;
          (this_00->mTransformation).b4 = fVar43;
          (this_00->mTransformation).c1 = fVar48;
          (this_00->mTransformation).c2 = fVar37;
          (this_00->mTransformation).c3 = fVar44;
          (this_00->mTransformation).c4 = fVar47;
          (this_00->mTransformation).d1 = local_158;
          (this_00->mTransformation).d2 = fVar38;
          (this_00->mTransformation).d3 = fVar36;
          (this_00->mTransformation).d4 = 1.0;
          uVar5 = local_d0->a1;
          uVar6 = local_d0->a2;
          uVar7 = local_d0->a3;
          uVar8 = local_d0->a4;
          uVar9 = local_d0->b1;
          uVar10 = local_d0->b2;
          uVar11 = local_d0->b3;
          uVar12 = local_d0->b4;
          uVar13 = local_d0->c1;
          uVar14 = local_d0->c2;
          uVar15 = local_d0->c3;
          uVar16 = local_d0->c4;
          uVar17 = local_d0->d1;
          uVar18 = local_d0->d2;
          uVar19 = local_d0->d3;
          uVar20 = local_d0->d4;
          local_e8 = local_158 * (float)uVar8 +
                     fVar48 * (float)uVar7 + fVar45 * (float)uVar5 + fVar50 * (float)uVar6;
          local_88 = fVar38 * (float)uVar8 +
                     fVar37 * (float)uVar7 + local_128 * (float)uVar5 + fVar49 * (float)uVar6;
          uStack_84 = uStack_e4;
          uStack_80 = uStack_e0;
          uStack_7c = uStack_dc;
          local_12c = fVar36 * (float)uVar8 +
                      fVar44 * (float)uVar7 + fVar41 * (float)uVar5 + fVar42 * (float)uVar6;
          local_130 = (float)uVar7 * fVar47 + (float)uVar5 * fVar40 + (float)uVar6 * fVar43 +
                      (float)uVar8;
          local_98 = local_158 * (float)uVar12 +
                     fVar48 * (float)uVar11 + fVar45 * (float)uVar9 + fVar50 * (float)uVar10;
          local_a8 = fVar38 * (float)uVar12 +
                     fVar37 * (float)uVar11 + local_128 * (float)uVar9 + fVar49 * (float)uVar10;
          uStack_a4 = uStack_e4;
          uStack_a0 = uStack_e0;
          uStack_9c = uStack_dc;
          local_134 = fVar36 * (float)uVar12 +
                      fVar44 * (float)uVar11 + fVar41 * (float)uVar9 + fVar42 * (float)uVar10;
          local_198._4_4_ = local_88;
          local_198._0_4_ = local_e8;
          local_198._12_4_ = local_130;
          local_198._8_4_ = local_12c;
          fStack_184 = local_a8;
          local_198._16_4_ = local_98;
          fStack_17c = (float)uVar11 * fVar47 + (float)uVar9 * fVar40 + (float)uVar10 * fVar43 +
                       (float)uVar12;
          fStack_180 = local_134;
          fStack_174 = fVar38 * (float)uVar16 +
                       fVar37 * (float)uVar15 + local_128 * (float)uVar13 + fVar49 * (float)uVar14;
          local_178 = local_158 * (float)uVar16 +
                      fVar48 * (float)uVar15 + fVar45 * (float)uVar13 + fVar50 * (float)uVar14;
          fStack_16c = (float)uVar15 * fVar47 + (float)uVar13 * fVar40 + (float)uVar14 * fVar43 +
                       (float)uVar16;
          fStack_170 = fVar36 * (float)uVar16 +
                       fVar44 * (float)uVar15 + fVar41 * (float)uVar13 + fVar42 * (float)uVar14;
          fStack_164 = fVar38 * (float)uVar20 +
                       fVar37 * (float)uVar19 + local_128 * (float)uVar17 + fVar49 * (float)uVar18;
          local_168 = local_158 * (float)uVar20 +
                      fVar48 * (float)uVar19 + fVar45 * (float)uVar17 + fVar50 * (float)uVar18;
          fStack_15c = fVar47 * (float)uVar19 + fVar40 * (float)uVar17 + fVar43 * (float)uVar18 +
                       (float)uVar20;
          fStack_160 = fVar36 * (float)uVar20 +
                       fVar44 * (float)uVar19 + fVar41 * (float)uVar17 + fVar42 * (float)uVar18;
          paVar24 = local_140->mScene;
          uStack_e4 = uStack_154;
          uStack_e0 = uStack_150;
          uStack_dc = uStack_14c;
          uStack_94 = uStack_154;
          uStack_90 = uStack_150;
          uStack_8c = uStack_14c;
          if (paVar24->mNumMeshes != 0) {
            uVar33 = 0;
            do {
              paVar3 = paVar24->mMeshes[uVar33];
              if (paVar3->mNumBones != 0) {
                uVar26 = 0;
                do {
                  paVar4 = paVar3->mBones[uVar26];
                  uVar31 = (paVar4->mName).length;
                  if ((uVar31 == (this_00->mName).length) &&
                     (iVar21 = bcmp((paVar4->mName).data,(this_00->mName).data,(ulong)uVar31),
                     iVar21 == 0)) {
                    local_48 = local_168;
                    fStack_44 = fStack_164;
                    fStack_40 = fStack_160;
                    fStack_3c = fStack_15c;
                    local_58 = local_178;
                    fStack_54 = fStack_174;
                    fStack_50 = fStack_170;
                    fStack_4c = fStack_16c;
                    local_68 = stack0xfffffffffffffe78;
                    fStack_60 = fStack_180;
                    fStack_5c = fStack_17c;
                    local_78 = (pointer)local_198._0_8_;
                    sStack_70 = local_198._8_8_;
                    paVar25 = aiMatrix4x4t<float>::Inverse((aiMatrix4x4t<float> *)&local_78);
                    fVar40 = paVar25->a2;
                    fVar43 = paVar25->a3;
                    fVar47 = paVar25->a4;
                    fVar37 = paVar25->b1;
                    fVar38 = paVar25->b2;
                    fVar36 = paVar25->b3;
                    fVar39 = paVar25->b4;
                    fVar41 = paVar25->c1;
                    fVar42 = paVar25->c2;
                    fVar44 = paVar25->c3;
                    fVar45 = paVar25->c4;
                    fVar46 = paVar25->d1;
                    fVar49 = paVar25->d2;
                    fVar48 = paVar25->d3;
                    fVar50 = paVar25->d4;
                    (paVar4->mOffsetMatrix).a1 = paVar25->a1;
                    (paVar4->mOffsetMatrix).a2 = fVar40;
                    (paVar4->mOffsetMatrix).a3 = fVar43;
                    (paVar4->mOffsetMatrix).a4 = fVar47;
                    (paVar4->mOffsetMatrix).b1 = fVar37;
                    (paVar4->mOffsetMatrix).b2 = fVar38;
                    (paVar4->mOffsetMatrix).b3 = fVar36;
                    (paVar4->mOffsetMatrix).b4 = fVar39;
                    (paVar4->mOffsetMatrix).c1 = fVar41;
                    (paVar4->mOffsetMatrix).c2 = fVar42;
                    (paVar4->mOffsetMatrix).c3 = fVar44;
                    (paVar4->mOffsetMatrix).c4 = fVar45;
                    (paVar4->mOffsetMatrix).d1 = fVar46;
                    (paVar4->mOffsetMatrix).d2 = fVar49;
                    (paVar4->mOffsetMatrix).d3 = fVar48;
                    (paVar4->mOffsetMatrix).d4 = fVar50;
                  }
                  uVar26 = uVar26 + 1;
                } while (uVar26 < paVar3->mNumBones);
              }
              uVar33 = uVar33 + 1;
              paVar24 = local_140->mScene;
            } while (uVar33 < paVar24->mNumMeshes);
          }
          pvVar28 = local_108;
          pvVar30 = local_110;
          local_148 = (ulong)((int)local_148 + 1);
          puVar1 = (ulong *)((long)(local_108->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                            local_b8 * 8 + -8 + local_b0);
          *puVar1 = *puVar1 | local_c0;
          CollectChildJoints(local_140,local_110,local_108,this_00,(aiMatrix4x4 *)local_198);
          uVar33 = local_f8;
          paVar34 = local_100;
        }
      }
      uVar26 = local_f0 + 1;
      pTVar32 = (pvVar30->
                super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar26 < (ulong)(((long)(pvVar30->
                                     super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar32 >>
                              4) * 0x2e8ba2e8ba2e8ba3));
  }
  return;
}

Assistant:

void MS3DImporter :: CollectChildJoints(const std::vector<TempJoint>& joints,
    std::vector<bool>& hadit,
    aiNode* nd,
    const aiMatrix4x4& absTrafo)
{
    unsigned int cnt = 0;
    for(size_t i = 0; i < joints.size(); ++i) {
        if (!hadit[i] && !strcmp(joints[i].parentName,nd->mName.data)) {
            ++cnt;
        }
    }

    nd->mChildren = new aiNode*[nd->mNumChildren = cnt];
    cnt = 0;
    for(size_t i = 0; i < joints.size(); ++i) {
        if (!hadit[i] && !strcmp(joints[i].parentName,nd->mName.data)) {
            aiNode* ch = nd->mChildren[cnt++] = new aiNode(joints[i].name);
            ch->mParent = nd;

            ch->mTransformation = aiMatrix4x4::Translation(joints[i].position,aiMatrix4x4()=aiMatrix4x4())*
                aiMatrix4x4().FromEulerAnglesXYZ(joints[i].rotation);

            const aiMatrix4x4 abs = absTrafo*ch->mTransformation;
            for(unsigned int a = 0; a < mScene->mNumMeshes; ++a) {
                aiMesh* const msh = mScene->mMeshes[a];
                for(unsigned int n = 0; n < msh->mNumBones; ++n) {
                    aiBone* const bone = msh->mBones[n];

                    if(bone->mName == ch->mName) {
                        bone->mOffsetMatrix = aiMatrix4x4(abs).Inverse();
                    }
                }
            }

            hadit[i] = true;
            CollectChildJoints(joints,hadit,ch,abs);
        }
    }
}